

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O3

void helper_psignw_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s)

{
  uint16_t uVar1;
  
  if ((short)s->_w_ZMMReg[0] < 0) {
    uVar1 = -d->_w_ZMMReg[0];
  }
  else if (s->_w_ZMMReg[0] == 0) {
    uVar1 = 0;
  }
  else {
    uVar1 = d->_w_ZMMReg[0];
  }
  d->_w_ZMMReg[0] = uVar1;
  if ((short)s->_w_ZMMReg[1] < 0) {
    uVar1 = -d->_w_ZMMReg[1];
  }
  else if (s->_w_ZMMReg[1] == 0) {
    uVar1 = 0;
  }
  else {
    uVar1 = d->_w_ZMMReg[1];
  }
  d->_w_ZMMReg[1] = uVar1;
  if ((short)s->_w_ZMMReg[2] < 0) {
    uVar1 = -d->_w_ZMMReg[2];
  }
  else if (s->_w_ZMMReg[2] == 0) {
    uVar1 = 0;
  }
  else {
    uVar1 = d->_w_ZMMReg[2];
  }
  d->_w_ZMMReg[2] = uVar1;
  if ((short)s->_w_ZMMReg[3] < 0) {
    uVar1 = -d->_w_ZMMReg[3];
  }
  else if (s->_w_ZMMReg[3] == 0) {
    uVar1 = 0;
  }
  else {
    uVar1 = d->_w_ZMMReg[3];
  }
  d->_w_ZMMReg[3] = uVar1;
  if ((short)s->_w_ZMMReg[4] < 0) {
    uVar1 = -d->_w_ZMMReg[4];
  }
  else if (s->_w_ZMMReg[4] == 0) {
    uVar1 = 0;
  }
  else {
    uVar1 = d->_w_ZMMReg[4];
  }
  d->_w_ZMMReg[4] = uVar1;
  if ((short)s->_w_ZMMReg[5] < 0) {
    uVar1 = -d->_w_ZMMReg[5];
  }
  else if (s->_w_ZMMReg[5] == 0) {
    uVar1 = 0;
  }
  else {
    uVar1 = d->_w_ZMMReg[5];
  }
  d->_w_ZMMReg[5] = uVar1;
  if ((short)s->_w_ZMMReg[6] < 0) {
    uVar1 = -d->_w_ZMMReg[6];
  }
  else if (s->_w_ZMMReg[6] == 0) {
    uVar1 = 0;
  }
  else {
    uVar1 = d->_w_ZMMReg[6];
  }
  d->_w_ZMMReg[6] = uVar1;
  if ((short)s->_w_ZMMReg[7] < 0) {
    uVar1 = -d->_w_ZMMReg[7];
  }
  else if (s->_w_ZMMReg[7] == 0) {
    uVar1 = 0;
  }
  else {
    uVar1 = d->_w_ZMMReg[7];
  }
  d->_w_ZMMReg[7] = uVar1;
  return;
}

Assistant:

void glue(helper_palignr, SUFFIX)(CPUX86State *env, Reg *d, Reg *s,
                                  int32_t shift)
{
    Reg r;

    /* XXX could be checked during translation */
    if (shift >= (16 << SHIFT)) {
        r.Q(0) = 0;
        XMM_ONLY(r.Q(1) = 0);
    } else {
        shift <<= 3;
#define SHR(v, i) (i < 64 && i > -64 ? i > 0 ? v >> (i) : (v << -(i)) : 0)
#if SHIFT == 0
        r.Q(0) = SHR(s->Q(0), shift - 0) |
            SHR(d->Q(0), shift -  64);
#else
        r.Q(0) = SHR(s->Q(0), shift - 0) |
            SHR(s->Q(1), shift -  64) |
            SHR(d->Q(0), shift - 128) |
            SHR(d->Q(1), shift - 192);
        r.Q(1) = SHR(s->Q(0), shift + 64) |
            SHR(s->Q(1), shift -   0) |
            SHR(d->Q(0), shift -  64) |
            SHR(d->Q(1), shift - 128);
#endif
#undef SHR
    }

    *d = r;
}